

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ViconCGStreamBayer.cpp
# Opt level: O0

void VViconCGStreamBayer::BayerRGToBGR
               (uint i_Width,uint i_Height,uchar *i_pBayerData,uchar *o_pBGRData)

{
  int local_44;
  int local_40;
  uint X_1;
  uint X;
  uint Y;
  uchar *pBGR;
  uchar *pLine;
  uchar *pLineAbove;
  uchar *o_pBGRData_local;
  uchar *i_pBayerData_local;
  uint i_Height_local;
  uint i_Width_local;
  
  if ((i_Width & 1) != 0) {
    __assert_fail("( i_Width % 2 ) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/whoenig[P]vicon-datastream-sdk/Vicon/CrossMarket/DataStream/ViconCGStreamClient/ViconCGStreamBayer.cpp"
                  ,0xbd,
                  "static void VViconCGStreamBayer::BayerRGToBGR(unsigned int, unsigned int, const unsigned char *, unsigned char *)"
                 );
  }
  if ((i_Height & 1) != 0) {
    __assert_fail("( i_Height % 2 ) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/whoenig[P]vicon-datastream-sdk/Vicon/CrossMarket/DataStream/ViconCGStreamClient/ViconCGStreamBayer.cpp"
                  ,0xbe,
                  "static void VViconCGStreamBayer::BayerRGToBGR(unsigned int, unsigned int, const unsigned char *, unsigned char *)"
                 );
  }
  memset(o_pBGRData,0,(ulong)(i_Width * 3));
  pBGR = i_pBayerData + i_Width;
  _X = o_pBGRData + i_Width * 3;
  pLine = i_pBayerData;
  for (X_1 = 1; X_1 < i_Height; X_1 = X_1 + 1) {
    if ((X_1 & 1) == 0) {
      for (local_40 = 0; local_40 + 1U < i_Width; local_40 = local_40 + 2) {
        *_X = pBGR[1];
        _X[1] = (uchar)((ulong)((uint)pLine[1] + (uint)*pBGR) / 2);
        _X[2] = *pLine;
        _X[3] = pBGR[1];
        _X[4] = (uchar)((ulong)((uint)pLine[1] + (uint)pBGR[2]) / 2);
        _X[5] = pLine[2];
        pBGR = pBGR + 2;
        pLine = pLine + 2;
        _X = _X + 6;
      }
    }
    else {
      for (local_44 = 0; local_44 + 1U < i_Width; local_44 = local_44 + 2) {
        *_X = pLine[1];
        _X[1] = (uchar)((ulong)((uint)pBGR[1] + (uint)*pLine) / 2);
        _X[2] = *pBGR;
        _X[3] = pLine[1];
        _X[4] = (uchar)((ulong)((uint)pBGR[1] + (uint)pLine[2]) / 2);
        _X[5] = pBGR[2];
        pBGR = pBGR + 2;
        pLine = pLine + 2;
        _X = _X + 6;
      }
    }
    _X[-1] = '\0';
    _X[-2] = '\0';
    _X[-3] = '\0';
  }
  return;
}

Assistant:

void VViconCGStreamBayer::BayerRGToBGR( unsigned int i_Width, unsigned int i_Height, const unsigned char * i_pBayerData, unsigned char * o_pBGRData )
{
  assert( ( i_Width  % 2 ) == 0 );
  assert( ( i_Height % 2 ) == 0 );

  std::memset( o_pBGRData, 0, i_Width * 3 );

  const unsigned char * pLineAbove = i_pBayerData;
  const unsigned char * pLine = i_pBayerData + i_Width;
  unsigned char * pBGR = o_pBGRData + i_Width * 3;

  for( unsigned int Y = 1; Y < i_Height; Y++ )
  {
    if( ( Y & 1 ) == 0 )
    {
      for( unsigned int X = 0; ( X + 1 ) < i_Width; X += 2 )
      {
        // Second line (odd lines): green, blue
        pBGR[ 0 ] = pLine[ 1 ];
        pBGR[ 1 ] = ( pLineAbove[ 1 ] + pLine[ 0 ] ) / 2;
        pBGR[ 2 ] = pLineAbove[ 0 ];

        pLine++;
        pLineAbove++;
        pBGR += 3;

        pBGR[ 0 ] = pLine[ 0 ];
        pBGR[ 1 ] = ( pLineAbove[ 0 ] + pLine[ 1 ] ) / 2;
        pBGR[ 2 ] = pLineAbove[ 1 ];

        pLine++;
        pLineAbove++;
        pBGR += 3;
      }
    }
    else
    {
      for( unsigned int X = 0; ( X + 1 ) < i_Width; X += 2 )
      {
        // First line (odd lines): red, green
        pBGR[ 0 ] = pLineAbove[ 1 ];
        pBGR[ 1 ] = ( pLine[ 1 ] + pLineAbove[ 0 ] ) / 2;
        pBGR[ 2 ] = pLine[ 0 ];

        pLine++;
        pLineAbove++;
        pBGR += 3;

        pBGR[ 0 ] = pLineAbove[ 0 ];
        pBGR[ 1 ] = ( pLine[ 0 ] + pLineAbove[ 1 ] ) / 2;
        pBGR[ 2 ] = pLine[ 1 ];

        pLine++;
        pLineAbove++;
        pBGR += 3;
      }
    }

    // Clear right-hand edge.
    *( pBGR - 1 ) = 0;
    *( pBGR - 2 ) = 0;
    *( pBGR - 3 ) = 0;
  }
}